

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

int Gia_MuxStructDump(Gia_Man_t *p,int iObj,Vec_Str_t *vStr,int nDigitsNum,int nDigitsId)

{
  uint uVar1;
  size_t __size;
  int Num;
  int iVar2;
  char *pcVar3;
  
  if ((p->pMuxes == (uint *)0x0) || (p->pMuxes[iObj] == 0)) {
    __assert_fail("Gia_ObjIsMuxId(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x1c9,"int Gia_MuxStructDump(Gia_Man_t *, int, Vec_Str_t *, int, int)");
  }
  Num = Gia_MuxDeref(p,iObj);
  vStr->nSize = 0;
  Vec_StrPrintNumStar(vStr,Num,nDigitsNum);
  Gia_MuxStructDump_rec(p,iObj,1,vStr,nDigitsId);
  uVar1 = vStr->nSize;
  if (uVar1 == vStr->nCap) {
    if ((int)uVar1 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar3;
      vStr->nCap = 0x10;
    }
    else {
      __size = (ulong)uVar1 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(__size);
      }
      else {
        pcVar3 = (char *)realloc(vStr->pArray,__size);
      }
      vStr->pArray = pcVar3;
      vStr->nCap = (int)__size;
    }
  }
  else {
    pcVar3 = vStr->pArray;
  }
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  pcVar3[iVar2] = '\0';
  iVar2 = Gia_MuxRef(p,iObj);
  if (Num == iVar2) {
    return Num;
  }
  __assert_fail("Count1 == Count2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                ,0x1d0,"int Gia_MuxStructDump(Gia_Man_t *, int, Vec_Str_t *, int, int)");
}

Assistant:

int Gia_MuxStructDump( Gia_Man_t * p, int iObj, Vec_Str_t * vStr, int nDigitsNum, int nDigitsId )
{
    int Count1, Count2;
    assert( Gia_ObjIsMuxId(p, iObj) );
    Count1 = Gia_MuxDeref( p, iObj );
    Vec_StrClear( vStr );
    Vec_StrPrintNumStar( vStr, Count1, nDigitsNum );
    Gia_MuxStructDump_rec( p, iObj, 1, vStr, nDigitsId );
    Vec_StrPush( vStr, '\0' );
    Count2 = Gia_MuxRef( p, iObj );
    assert( Count1 == Count2 );
    return Count1;
}